

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  bool bVar2;
  ContextType CVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar7;
  long *plVar4;
  ulong *puVar5;
  TestError *pTVar6;
  long *plVar8;
  size_type *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  undefined4 local_2d8;
  TestShaderType local_2d4;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string invalid_size_declarations [15];
  
  invalid_size_declarations[0]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0].field_2;
  local_300 = this;
  local_2d4 = tested_shader_type;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)invalid_size_declarations,"[0][0][0][y]","");
  invalid_size_declarations[1]._M_dataplus._M_p = (pointer)&invalid_size_declarations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 1),"[0][0][y][0]","");
  invalid_size_declarations[2]._M_dataplus._M_p = (pointer)&invalid_size_declarations[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 2),"[0][y][0][0]","");
  invalid_size_declarations[3]._M_dataplus._M_p = (pointer)&invalid_size_declarations[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 3),"[y][0][0][0]","");
  invalid_size_declarations[4]._M_dataplus._M_p = (pointer)&invalid_size_declarations[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 4),"[0][0][y][y]","");
  invalid_size_declarations[5]._M_dataplus._M_p = (pointer)&invalid_size_declarations[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 5),"[0][y][0][y]","");
  invalid_size_declarations[6]._M_dataplus._M_p = (pointer)&invalid_size_declarations[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 6),"[y][0][0][y]","");
  invalid_size_declarations[7]._M_dataplus._M_p = (pointer)&invalid_size_declarations[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 7),"[0][y][y][0]","");
  invalid_size_declarations[8]._M_dataplus._M_p = (pointer)&invalid_size_declarations[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 8),"[y][0][y][0]","");
  invalid_size_declarations[9]._M_dataplus._M_p = (pointer)&invalid_size_declarations[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 9),"[y][y][0][0]","");
  invalid_size_declarations[10]._M_dataplus._M_p = (pointer)&invalid_size_declarations[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 10),"[0][y][y][y]","");
  invalid_size_declarations[0xb]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xb].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xb),"[y][0][y][y]","");
  invalid_size_declarations[0xc]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xc].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xc),"[y][y][0][y]","");
  invalid_size_declarations[0xd]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xd].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xd),"[y][y][y][0]","");
  paVar13 = &invalid_size_declarations[0xe].field_2;
  invalid_size_declarations[0xe]._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xe),"[y][y][y][y]","");
  CVar3.super_ApiType.m_bits =
       (ApiType)(*((local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)
                  ->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  uVar7 = extraout_var;
  if (!bVar2) {
    CVar3.super_ApiType.m_bits =
         (ApiType)(*((local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                    context_id)->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(CVar3,(ApiType)0x104);
    uVar7 = extraout_var_00;
    if (!bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                         context_id)->m_contextInfo,"GL_EXT_gpu_shader5");
      uVar7 = extraout_var_01;
      if (!bVar2) {
        local_2d8 = 0;
        goto LAB_00b5b018;
      }
    }
  }
  local_2d8 = (undefined4)CONCAT71(uVar7,1);
LAB_00b5b018:
  lVar12 = 0;
  while (supported_variable_types_map._16_8_ != 0) {
    iVar1 = (&opaque_var_types)[lVar12];
    lVar10 = 0x21f1cb8;
    lVar11 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar11 + 0x20)) {
        lVar10 = lVar11;
      }
      lVar11 = *(long *)(lVar11 + 0x10 + (ulong)(*(int *)(lVar11 + 0x20) < iVar1) * 8);
    } while (lVar11 != 0);
    if ((lVar10 == 0x21f1cb8) || (iVar1 < *(int *)(lVar10 + 0x20))) break;
    lVar11 = 8;
    do {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&shader_source,"int y = 1;\n","");
      std::operator+(&local_2b0,"uniform ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar10 + 0x48));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_320 = &local_310;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_310 = *plVar8;
        lStack_308 = plVar4[3];
      }
      else {
        local_310 = *plVar8;
        local_320 = (long *)*plVar4;
      }
      local_318 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_320,*(ulong *)(lVar10 + 0x28))
      ;
      local_2f8 = &local_2e8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_2e8 = *plVar8;
        lStack_2e0 = plVar4[3];
      }
      else {
        local_2e8 = *plVar8;
        local_2f8 = (long *)*plVar4;
      }
      local_2f0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_2c0 = *plVar8;
        lStack_2b8 = plVar4[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *plVar8;
        local_2d0 = (long *)*plVar4;
      }
      local_2c8 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_2d0);
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_320 != &local_310) {
        operator_delete(local_320,local_310 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::append((char *)&shader_source);
      std::operator+(&local_238,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar10 + 0x168));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_290 = &local_280;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_280 = *plVar8;
        lStack_278 = plVar4[3];
      }
      else {
        local_280 = *plVar8;
        local_290 = (long *)*plVar4;
      }
      local_288 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_290,
                                  *(ulong *)((long)invalid_size_declarations + lVar11 + -8));
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2b0.field_2._M_allocated_capacity = *psVar9;
        local_2b0.field_2._8_8_ = plVar4[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar9;
        local_2b0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_2b0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_320 = &local_310;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_310 = *plVar8;
        lStack_308 = plVar4[3];
      }
      else {
        local_310 = *plVar8;
        local_320 = (long *)*plVar4;
      }
      local_318 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_320,*(ulong *)(lVar10 + 0x148));
      local_2f8 = &local_2e8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_2e8 = *plVar8;
        lStack_2e0 = plVar4[3];
      }
      else {
        local_2e8 = *plVar8;
        local_2f8 = (long *)*plVar4;
      }
      local_2f0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_2c0 = *plVar8;
        lStack_2b8 = plVar4[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *plVar8;
        local_2d0 = (long *)*plVar4;
      }
      local_2c8 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_2d0);
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_320 != &local_310) {
        operator_delete(local_320,local_310 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (TESSELATION_EVALUATION_SHADER_TYPE < local_2d4) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd55);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar14 = (ulong)local_2d4;
      puVar5 = &set_tesseation_abi_cxx11_;
      switch(uVar14) {
      case 1:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case 3:
        puVar5 = &emit_quad_abi_cxx11_;
      case 4:
        std::__cxx11::string::_M_append((char *)&shader_source,*puVar5);
      }
      std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
      if ((char)local_2d8 != '\0') {
        (*(code *)(&DAT_01ad3f34 + *(int *)(&DAT_01ad3f34 + uVar14 * 4)))
                  (&DAT_01ad3f34 + *(int *)(&DAT_01ad3f34 + uVar14 * 4),empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_);
        return;
      }
      (*(local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(local_300,(ulong)local_2d4,&shader_source);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        shader_source.field_2._M_allocated_capacity + 1);
      }
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x1e8);
    lVar12 = lVar12 + 1;
    if (lVar12 == 0xf) {
      lVar12 = -0x1e0;
      do {
        plVar4 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
        if (paVar13 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar4) {
          operator_delete(plVar4,paVar13->_M_allocated_capacity + 1);
        }
        paVar13 = paVar13 + -2;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      return;
    }
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xd63);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsDynamicIndexing2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int				  num_var_types				  = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);
	const std::string invalid_size_declarations[] = { "[0][0][0][y]", "[0][0][y][0]", "[0][y][0][0]", "[y][0][0][0]",
													  "[0][0][y][y]", "[0][y][0][y]", "[y][0][0][y]", "[0][y][y][0]",
													  "[y][0][y][0]", "[y][y][0][0]", "[0][y][y][y]", "[y][0][y][y]",
													  "[y][y][0][y]", "[y][y][y][0]", "[y][y][y][y]" };

	bool dynamic_indexing_supported = false;
	if (glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::es(3, 2)) ||
		glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::core(4, 0)) ||
		this->context_id.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
	{
		dynamic_indexing_supported = true;
	}

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			int num_invalid_size_declarations =
				sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);

			for (int invalid_size_index = 0; invalid_size_index < num_invalid_size_declarations; invalid_size_index++)
			{
				std::string shader_source = "int y = 1;\n";

				shader_source += "uniform " + var_iterator->second.precision + " " + var_iterator->second.type +
								 " x[2][2][2][2];\n\n";
				shader_source += "void main()\n";
				shader_source += "{\n";
				shader_source += ("    " + var_iterator->second.type_of_result_of_texture_function +
								  " color = texture(x" + invalid_size_declarations[invalid_size_index] + ", " +
								  var_iterator->second.coord_param_for_texture_function + ");\n");

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				if (dynamic_indexing_supported)
				{
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, true);
				}
				else
				{
					this->execute_negative_test(tested_shader_type, shader_source);
				}
			} /* for (int invalid_size_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}